

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_increment_node_count
          (Impl *this,SPIRVModule *param_1,bool per_thread)

{
  Builder *this_00;
  Instruction *pIVar1;
  pointer this_01;
  Block *elseBlock;
  Id IVar2;
  Id IVar3;
  Id returnType;
  Op OVar4;
  Function *pFVar5;
  undefined7 in_register_00000011;
  Impl *this_02;
  char *name;
  Block *pBVar6;
  long lVar7;
  Instruction *local_110;
  Block *entry;
  long local_100;
  Instruction *local_f8;
  Id local_f0;
  Id uint_type;
  undefined8 local_e8;
  Id local_e0;
  Block *local_d8;
  Function *local_d0;
  Id local_c4;
  uint local_c0;
  Id bool_type;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_b8;
  Block *local_98;
  Impl *local_90;
  Instruction *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_70;
  Block *local_68;
  undefined4 local_5c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_70 = (ulong)!per_thread;
  IVar2 = (&this->increment_thread_node_count_call_id)[local_70];
  if (IVar2 == 0) {
    this_00 = &this->builder;
    local_68 = (this->builder).buildPoint;
    entry = (Block *)0x0;
    bool_type = spv::Builder::makeBoolType(this_00);
    IVar2 = spv::Builder::makeUintType(this_00,0x20);
    uint_type = IVar2;
    local_90 = this;
    IVar3 = spv::Builder::makeUintType(this_00,0x40);
    returnType = spv::Builder::makeVoidType(this_00);
    name = "IncrementGroupNodeCount";
    if (per_thread) {
      name = "IncrementThreadNodeCount";
    }
    local_e8 = (Instruction *)CONCAT44(IVar2,IVar3);
    local_88 = (Instruction *)0x0;
    uStack_80 = 0;
    local_78 = 0;
    local_f0 = IVar2;
    local_e0 = IVar2;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_88,
               &local_e8);
    local_100 = CONCAT44(local_100._4_4_,(int)CONCAT71(in_register_00000011,per_thread));
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar5 = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,returnType,name,(Vector<Id> *)&local_88,&local_b8,
                        &entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_b8);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_88);
    spv::Builder::addName
              (this_00,(*(pFVar5->parameterInstructions).
                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->resultId,"AtomicCountersBDA");
    spv::Builder::addName
              (this_00,(pFVar5->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]->resultId,"NodeMetadataIndex");
    spv::Builder::addName
              (this_00,(pFVar5->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]->resultId,"Count");
    local_c4 = (pFVar5->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[2]->resultId;
    local_d0 = pFVar5;
    if ((char)local_100 == '\0') {
      local_d8 = (Block *)allocate_in_thread(0x78);
      this_02 = local_90;
      IVar2 = (local_90->builder).uniqueId + 1;
      (local_90->builder).uniqueId = IVar2;
      spv::Block::Block(local_d8,IVar2,pFVar5);
      local_98 = (Block *)allocate_in_thread(0x78);
      IVar2 = (this_02->builder).uniqueId + 1;
      (this_02->builder).uniqueId = IVar2;
      spv::Block::Block(local_98,IVar2,pFVar5);
    }
    else {
      local_98 = (Block *)0x0;
      local_d8 = (Block *)0x0;
      this_02 = local_90;
    }
    IVar2 = local_f0;
    IVar3 = spv::Builder::makeRuntimeArray(this_00,local_f0);
    spv::Builder::addDecoration(this_00,IVar3,DecorationArrayStride,4);
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar2;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = IVar2;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_b8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,IVar3);
    local_88 = (Instruction *)0x0;
    uStack_80 = 0;
    local_78 = 0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_88,
               &local_b8);
    IVar2 = spv::Builder::makeStructType(this_00,(Vector<Id> *)&local_88,"NodeAtomicsEmpty");
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_88);
    spv::Builder::addDecoration(this_00,IVar2,DecorationBlock,-1);
    spv::Builder::addMemberName(this_00,IVar2,0,"payloadCount");
    spv::Builder::addMemberName(this_00,IVar2,1,"fusedCount");
    spv::Builder::addMemberName(this_00,IVar2,2,"perNodeTotal");
    spv::Builder::addMemberDecoration(this_00,IVar2,0,DecorationOffset,0);
    spv::Builder::addMemberDecoration(this_00,IVar2,1,DecorationOffset,4);
    spv::Builder::addMemberDecoration(this_00,IVar2,2,DecorationOffset,8);
    IVar3 = (this_02->builder).uniqueId + 1;
    (this_02->builder).uniqueId = IVar3;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_b8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar3);
    OVar4 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar2);
    local_f8._0_4_ = 0x7c;
    local_e8._0_4_ = OVar4;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_88,(uint *)&local_b8,(Op *)&local_e8);
    spv::Instruction::addIdOperand
              (local_88,(*(local_d0->parameterInstructions).
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->resultId);
    IVar2 = (this_02->builder).uniqueId + 1;
    (this_02->builder).uniqueId = IVar2;
    local_e8 = (Instruction *)CONCAT44(local_e8._4_4_,IVar2);
    local_f8._0_4_ = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,local_f0);
    local_110._0_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_b8,(uint *)&local_e8,(Op *)&local_f8);
    spv::Instruction::addIdOperand
              ((Instruction *)
               local_b8.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,local_88->resultId);
    this_01 = local_b8.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    IVar2 = spv::Builder::makeUintConstant(this_00,2,false);
    spv::Instruction::addIdOperand((Instruction *)this_01,IVar2);
    pFVar5 = local_d0;
    spv::Instruction::addIdOperand
              ((Instruction *)
               local_b8.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (local_d0->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1]->resultId);
    IVar2 = (this_02->builder).uniqueId + 1;
    (this_02->builder).uniqueId = IVar2;
    local_f8 = (Instruction *)CONCAT44(local_f8._4_4_,IVar2);
    local_110 = (Instruction *)CONCAT44(local_110._4_4_,0xea);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_e8,(uint *)&local_f8,&uint_type);
    spv::Instruction::addIdOperand
              (local_e8,*(Id *)((long)local_b8.
                                      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8));
    pIVar1 = local_e8;
    IVar2 = spv::Builder::makeUintConstant(this_00,1,false);
    spv::Instruction::addIdOperand(pIVar1,IVar2);
    pIVar1 = local_e8;
    IVar2 = spv::Builder::makeUintConstant(this_00,0,false);
    spv::Instruction::addIdOperand(pIVar1,IVar2);
    spv::Instruction::addIdOperand(local_e8,local_c4);
    pBVar6 = local_d8;
    if ((char)local_100 != '\0') {
      pBVar6 = entry;
    }
    local_38._M_head_impl = local_88;
    local_88 = (Instruction *)0x0;
    add_instruction(this_02,pBVar6,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    local_40._M_head_impl =
         (Instruction *)
         local_b8.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    add_instruction(this_02,pBVar6,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = local_e8;
    local_e8 = (Instruction *)0x0;
    add_instruction(this_02,pBVar6,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    lVar7 = local_70 * 4 + 0xdd4;
    if ((char)local_100 == '\0') {
      local_100 = lVar7;
      IVar2 = get_builtin_shader_input(this_02,BuiltInLocalInvocationIndex);
      IVar3 = (this_02->builder).uniqueId + 1;
      (this_02->builder).uniqueId = IVar3;
      local_110 = (Instruction *)CONCAT44(local_110._4_4_,IVar3);
      local_c0 = 0x3d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_f8,(uint *)&local_110,&uint_type);
      spv::Instruction::addIdOperand(local_f8,IVar2);
      local_c0 = (this_02->builder).uniqueId + 1;
      (this_02->builder).uniqueId = local_c0;
      local_5c = 0xaa;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_110,&local_c0,&bool_type);
      spv::Instruction::addIdOperand(local_110,local_f8->resultId);
      pIVar1 = local_110;
      IVar2 = spv::Builder::makeUintConstant(this_00,0,false);
      spv::Instruction::addIdOperand(pIVar1,IVar2);
      IVar2 = local_110->resultId;
      local_50._M_head_impl = local_f8;
      local_f8 = (Instruction *)0x0;
      add_instruction(this_02,entry,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_50);
      if (local_50._M_head_impl != (Instruction *)0x0) {
        (*(local_50._M_head_impl)->_vptr_Instruction[1])();
      }
      local_58._M_head_impl = local_110;
      local_110 = (Instruction *)0x0;
      add_instruction(this_02,entry,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_58);
      if (local_58._M_head_impl != (Instruction *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Instruction[1])();
      }
      elseBlock = local_98;
      (this_02->builder).buildPoint = entry;
      spv::Builder::createSelectionMerge(this_00,local_98,0);
      pBVar6 = local_d8;
      spv::Builder::createConditionalBranch(this_00,IVar2,local_d8,elseBlock);
      (this_02->builder).buildPoint = pBVar6;
      spv::Builder::createBranch(this_00,elseBlock);
      (this_02->builder).buildPoint = elseBlock;
      spv::Builder::makeReturn(this_00,false,0);
      pFVar5 = local_d0;
      if (local_110 != (Instruction *)0x0) {
        (*local_110->_vptr_Instruction[1])();
      }
      lVar7 = local_100;
      if (local_f8 != (Instruction *)0x0) {
        (*local_f8->_vptr_Instruction[1])();
      }
    }
    else {
      (this_02->builder).buildPoint = entry;
      spv::Builder::makeReturn(this_00,false,0);
    }
    (this_02->builder).buildPoint = local_68;
    IVar2 = (pFVar5->functionInstruction).resultId;
    *(Id *)((long)&(this_02->super_BlockEmissionInterface)._vptr_BlockEmissionInterface + lVar7) =
         IVar2;
    if (local_e8 != (Instruction *)0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    if (local_b8.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_b8.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_88 != (Instruction *)0x0) {
      (*local_88->_vptr_Instruction[1])();
    }
  }
  return IVar2;
}

Assistant:

spv::Id SPIRVModule::Impl::build_increment_node_count(SPIRVModule &, bool per_thread)
{
	auto &call_id = per_thread ? increment_thread_node_count_call_id : increment_group_node_count_call_id;
	if (call_id)
		return call_id;
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uint64_type = builder.makeUintType(64);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(),
	                                       per_thread ? "IncrementThreadNodeCount" : "IncrementGroupNodeCount",
	                                       { uint64_type, uint_type, uint_type },
	                                       {}, &entry);

	builder.addName(func->getParamId(0), "AtomicCountersBDA");
	builder.addName(func->getParamId(1), "NodeMetadataIndex");
	builder.addName(func->getParamId(2), "Count");

	spv::Id total_count_id = func->getParamId(2);

	spv::Block *body_block = nullptr;
	spv::Block *merge_block = nullptr;

	if (!per_thread)
	{
		body_block = new spv::Block(builder.getUniqueId(), *func);
		merge_block = new spv::Block(builder.getUniqueId(), *func);
	}

	spv::Id uint_array_type = builder.makeRuntimeArray(uint_type);
	builder.addDecoration(uint_array_type, spv::DecorationArrayStride, 4);
	spv::Id struct_type_id = builder.makeStructType({ uint_type, uint_type, uint_array_type }, "NodeAtomicsEmpty");
	builder.addDecoration(struct_type_id, spv::DecorationBlock);
	builder.addMemberName(struct_type_id, 0, "payloadCount");
	builder.addMemberName(struct_type_id, 1, "fusedCount");
	builder.addMemberName(struct_type_id, 2, "perNodeTotal");
	builder.addMemberDecoration(struct_type_id, 0, spv::DecorationOffset, 0);
	builder.addMemberDecoration(struct_type_id, 1, spv::DecorationOffset, 4);
	builder.addMemberDecoration(struct_type_id, 2, spv::DecorationOffset, 8);

	auto cast_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(),
	    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, struct_type_id),
	    spv::OpBitcast);
	cast_op->addIdOperand(func->getParamId(0));

	auto chain_index_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(),
	    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
	    spv::OpInBoundsAccessChain);
	chain_index_op->addIdOperand(cast_op->getResultId());
	chain_index_op->addIdOperand(builder.makeUintConstant(2));
	chain_index_op->addIdOperand(func->getParamId(1));

	auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
	atomic_op->addIdOperand(chain_index_op->getResultId());
	atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
	atomic_op->addIdOperand(total_count_id);

	auto *body = per_thread ? entry : body_block;
	add_instruction(body, std::move(cast_op));
	add_instruction(body, std::move(chain_index_op));
	add_instruction(body, std::move(atomic_op));

	if (!per_thread)
	{
		spv::Id local_invocation_index = get_builtin_shader_input(spv::BuiltInLocalInvocationIndex);
		auto load_local_index = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_local_index->addIdOperand(local_invocation_index);

		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
		is_first_lane->addIdOperand(load_local_index->getResultId());
		is_first_lane->addIdOperand(builder.makeUintConstant(0));
		spv::Id is_first_lane_id = is_first_lane->getResultId();
		add_instruction(entry, std::move(load_local_index));
		add_instruction(entry, std::move(is_first_lane));

		builder.setBuildPoint(entry);
		builder.createSelectionMerge(merge_block, 0);
		builder.createConditionalBranch(is_first_lane_id, body_block, merge_block);

		builder.setBuildPoint(body_block);
		builder.createBranch(merge_block);
		builder.setBuildPoint(merge_block);
		builder.makeReturn(false);
	}
	else
	{
		builder.setBuildPoint(entry);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	call_id = func->getId();
	return func->getId();
}